

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

BOOL __thiscall
Js::TypedArray<unsigned_char,_true,_false>::DirectSetItemNoSet
          (TypedArray<unsigned_char,_true,_false> *this,uint32 index,Var value)

{
  JavascriptConversion::ToUInt8Clamped
            (value,(((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                       super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
                   ->super_JavascriptLibraryBase).scriptContext.ptr);
  if (((this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached != true) {
    return 0;
  }
  JavascriptError::ThrowTypeError
            ((((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                 super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
}

Assistant:

inline BOOL Uint8ClampedArray::DirectSetItemNoSet(__in uint32 index, __in Js::Var value)
    {
        return BaseTypedDirectSetItemNoSet(index, value, JavascriptConversion::ToUInt8Clamped);
    }